

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

void __thiscall Table::load_all(Table *this)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"keywords.txt",&local_29);
  load_keywords(this,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"operators.txt",&local_29);
  load_operators(this,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"delimiters.txt",&local_29);
  load_delimiters(this,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"escape_characters.txt",&local_29);
  load_escape_chars(this,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void Table::load_all() {
    load_keywords("keywords.txt");
    load_operators("operators.txt");
    load_delimiters("delimiters.txt");
    load_escape_chars("escape_characters.txt");
}